

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O1

sexp_conflict
sexp_open_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,
              sexp_conflict arg1,sexp_conflict arg2)

{
  long lVar1;
  sexp_conflict psVar2;
  int iVar3;
  undefined8 uVar4;
  
  if ((((ulong)arg0 & 3) == 0) && (arg0->tag == 9)) {
    if ((((ulong)arg1 & 1) == 0) && ((((ulong)arg1 & 2) != 0 || (arg1->tag != 0xc)))) {
      uVar4 = 2;
      arg2 = arg1;
    }
    else {
      if ((((ulong)arg2 & 1) != 0) || ((((ulong)arg2 & 2) == 0 && (arg2->tag == 0xc)))) {
        if (((ulong)arg1 & 1) == 0) {
          if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
            iVar3 = (int)(arg1->value).flonum_bits[0] * (int)(arg1->value).uvector.length;
          }
          else {
            iVar3 = 0;
          }
        }
        else {
          iVar3 = (int)((long)arg1 >> 1);
        }
        if (((ulong)arg2 & 1) == 0) {
          if ((((ulong)arg2 & 2) == 0) && (arg2->tag == 0xc)) {
            lVar1 = (long)(arg2->value).flonum_bits[0] * (arg2->value).uvector.length;
          }
          else {
            lVar1 = 0;
          }
        }
        else {
          lVar1 = (long)arg2 >> 1;
        }
        iVar3 = open((((arg0->value).type.cpl)->value).flonum_bits +
                     (long)(((arg0->value).type.name)->value).flonum_bits,iVar3,lVar1);
        psVar2 = (sexp_conflict)sexp_make_fileno_op(ctx,0,2,(long)iVar3 * 2 + 1,0x3e);
        return psVar2;
      }
      uVar4 = 2;
    }
  }
  else {
    uVar4 = 9;
    arg2 = arg0;
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,uVar4,arg2);
  return psVar2;
}

Assistant:

sexp sexp_open_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2) {
  sexp res;
  if (! sexp_stringp(arg0))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  res = sexp_make_fileno(ctx, sexp_make_fixnum(open(sexp_string_data(arg0), sexp_sint_value(arg1), sexp_sint_value(arg2))), SEXP_FALSE);
  return res;
}